

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::ColumnChunk::~ColumnChunk(ColumnChunk *this,void **vtt)

{
  void *pvVar1;
  pointer pcVar2;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x30)) = vtt[1];
  pcVar2 = (this->encrypted_column_metadata)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->encrypted_column_metadata).field_2) {
    operator_delete(pcVar2);
  }
  *(undefined ***)&this->crypto_metadata = &PTR__ColumnCryptoMetaData_024b8bf0;
  EncryptionWithColumnKey::~EncryptionWithColumnKey
            (&(this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY,&EncryptionWithColumnKey::VTT);
  ColumnMetaData::~ColumnMetaData(&this->meta_data,&ColumnMetaData::VTT);
  pcVar2 = (this->file_path)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->file_path).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

ColumnChunk::~ColumnChunk() noexcept {
}